

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_unsigned.cpp
# Opt level: O2

sc_unsigned * __thiscall sc_dt::sc_unsigned::operator=(sc_unsigned *this,long v)

{
  small_type sVar1;
  unsigned_long v_00;
  
  if (v < 1) {
    if (v == 0) {
      this->sgn = 0;
      vec_zero(this->ndigits,this->digit);
      return this;
    }
    v_00 = -v;
    if ((ulong)v < 0x8000000000000001) {
      v_00 = 0x8000000000000000;
    }
    sVar1 = -1;
  }
  else {
    sVar1 = 1;
    v_00 = v;
  }
  this->sgn = sVar1;
  from_uint<unsigned_long>(this->ndigits,this->digit,v_00);
  convert_SM_to_2C_to_SM(this);
  return this;
}

Assistant:

const sc_unsigned&
sc_unsigned::operator=(long v)
{
  sgn = get_sign(v);
  if ( sgn == SC_ZERO ) {
    vec_zero(ndigits, digit);
  }
  else {
    from_uint(ndigits, digit, (unsigned long) v);
    convert_SM_to_2C_to_SM();
  }
  return *this;
}